

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O3

void standard_image_validate(standard_display *dp,png_const_structp pp,int iImage,int iDisplay)

{
  undefined1 *puVar1;
  byte bVar2;
  png_uint_32 where;
  uint uVar3;
  int iVar4;
  png_bytep ppVar5;
  byte bVar6;
  char *__format;
  uint uVar7;
  png_uint_32 y;
  char msg [64];
  png_byte std [1024];
  char local_478 [64];
  byte local_438 [1032];
  
  store_image_check(dp->ps,pp,0);
  if (-1 < iImage) {
    store_image_check(dp->ps,pp,iImage);
  }
  if (dp->h != 0) {
    y = 0;
    do {
      memset(local_438,0xb2,0x400);
      bVar2 = (byte)dp->id;
      bVar6 = bVar2 & 7;
      bVar2 = bVar2 >> 3;
      uVar7 = dp->id >> 0x10 & 0xff;
      if (uVar7 == 0) {
        transform_row(pp,local_438,bVar6,bVar2,y);
      }
      else {
        uVar3 = bit_size(pp,bVar6,bVar2);
        size_row(local_438,uVar7 * uVar3,y);
      }
      ppVar5 = store_image_row(dp->ps,pp,0,y);
      iVar4 = bcmp(local_438,ppVar5,(ulong)(dp->bit_width + 7 >> 3));
      if (iVar4 != 0) {
        uVar7 = 0;
        do {
          uVar3 = uVar7;
          uVar7 = uVar3 + 1;
        } while (local_438[uVar3] == ppVar5[uVar3]);
        if (uVar3 + 1 != 0) {
          bVar2 = local_438[(int)uVar3];
          ppVar5 = store_image_row(dp->ps,pp,0,y);
          bVar6 = ppVar5[(int)uVar3];
          __format = "PNG image row[%lu][%d] changed from %.2x to %.2x";
          goto LAB_00111661;
        }
      }
      if (-1 < iImage) {
        ppVar5 = store_image_row(dp->ps,pp,iImage,y);
        iVar4 = bcmp(local_438,ppVar5,(ulong)(dp->bit_width + 7 >> 3));
        if (iVar4 != 0) {
          uVar7 = 0;
          do {
            uVar3 = uVar7;
            uVar7 = uVar3 + 1;
          } while (local_438[uVar3] == ppVar5[uVar3]);
          if (uVar3 + 1 != 0) {
            bVar2 = local_438[(int)uVar3];
            ppVar5 = store_image_row(dp->ps,pp,iImage,y);
            bVar6 = ppVar5[(int)uVar3];
            __format = "display row[%lu][%d] changed from %.2x to %.2x";
LAB_00111661:
            sprintf(local_478,__format,(ulong)y,(ulong)uVar3,(ulong)bVar2,(ulong)bVar6);
            png_error(pp,local_478);
          }
        }
      }
      y = y + 1;
    } while (y < dp->h);
  }
  puVar1 = &dp->ps->field_0x18;
  *puVar1 = *puVar1 | 0x80;
  return;
}

Assistant:

static void
standard_image_validate(standard_display *dp, png_const_structp pp, int iImage,
    int iDisplay)
{
   png_uint_32 y;

   if (iImage >= 0)
      store_image_check(dp->ps, pp, iImage);

   if (iDisplay >= 0)
      store_image_check(dp->ps, pp, iDisplay);

   for (y=0; y<dp->h; ++y)
      standard_row_validate(dp, pp, iImage, iDisplay, y);

   /* This avoids false positives if the validation code is never called! */
   dp->ps->validated = 1;
}